

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CERunningDate.cpp
# Opt level: O2

bool __thiscall test_CERunningDate::test_timer_manip(test_CERunningDate *this)

{
  undefined1 uVar1;
  double new_speed;
  CERunningDate test1;
  allocator local_9d;
  undefined4 local_9c;
  double local_98;
  double local_90;
  double local_88;
  string local_80 [32];
  CERunningDate local_60;
  
  CERunningDate::CERunningDate(&local_60,&this->base_);
  local_90 = CERunningDate::GetTimerSpeed(&local_60);
  local_98 = 1.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"test_timer_manip",(allocator *)&local_9c);
  local_88._0_4_ = 0x69;
  (**(code **)(*(long *)this + 0x58))(this,&local_90,&local_98,local_80);
  std::__cxx11::string::~string(local_80);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_9c);
  local_90 = 100.0;
  CERunningDate::SetTimerSpeed(&local_60,&local_90);
  local_98 = CERunningDate::GetTimerSpeed(&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"test_timer_manip",(allocator *)&local_9c);
  local_88 = (double)CONCAT44(local_88._4_4_,0x6c);
  (**(code **)(*(long *)this + 0x58))(this,&local_98,&local_90,local_80);
  std::__cxx11::string::~string(local_80);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_9c);
  CERunningDate::ResetTime(&local_60);
  CERunningDate::SetTimerSpeed(&local_60,&local_90);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&this->naptime_);
  local_98 = CERunningDate::ScaledRunTime(&local_60);
  local_88 = ((double)this->naptime_ms_ + (double)this->naptime_ms_) / 1000.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"test_timer_manip",&local_9d);
  local_9c = 0x72;
  CETestSuite::test_greaterthan((double *)this,&local_98,(string *)&local_88,(int *)local_80);
  std::__cxx11::string::~string(local_80);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_9d);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  CERunningDate::~CERunningDate(&local_60);
  return (bool)uVar1;
}

Assistant:

bool test_CERunningDate::test_timer_manip(void)
{
    // Get a copy of the base timer
    CERunningDate test1(base_);
    
    // Test updating the timer speed
    test_double(test1.GetTimerSpeed(), 1.0, __func__, __LINE__);
    double new_speed(100.0);
    test1.SetTimerSpeed(new_speed);
    test_double(test1.GetTimerSpeed(), new_speed, __func__, __LINE__);
    
    // Pause for some amount of time and test that the 
    test1.ResetTime();
    test1.SetTimerSpeed(new_speed);
    std::this_thread::sleep_for(naptime_);
    test_greaterthan(test1.ScaledRunTime(), naptime_ms_*2.0/1000.0, __func__, __LINE__);

    // Reset the timer
    return pass();
}